

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c
# Opt level: O2

sexp_conflict json_read(sexp_conflict ctx,sexp_conflict self,sexp_conflict in)

{
  sexp psVar1;
  sexp psVar2;
  sexp_uint_t sVar3;
  uint __c;
  ushort **ppuVar4;
  sexp_conflict psVar5;
  char *pcVar6;
  char *self_00;
  
  __c = 0x20;
  self_00 = (char *)self;
  ppuVar4 = __ctype_b_loc();
  while( true ) {
    if ((*(byte *)((long)*ppuVar4 + (long)(int)__c * 2 + 1) & 0x20) == 0) break;
    psVar1 = (in->value).type.setters;
    if (psVar1 == (sexp)0x0) {
      __c = getc((FILE *)(in->value).type.getters);
    }
    else {
      psVar2 = (in->value).type.print;
      if (psVar2 < (sexp)(in->value).port.size) {
        (in->value).type.print = (sexp)((long)&psVar2->tag + 1);
        __c = (uint)*(byte *)((long)&psVar2->tag + (long)&psVar1->tag);
      }
      else {
        self_00 = (char *)in;
        __c = sexp_buffered_read_char(ctx);
      }
    }
  }
  if (__c - 0x30 < 10) {
LAB_001032a7:
    sVar3 = (in->value).bytecode.max_depth;
    if (sVar3 == 0) {
      self_00 = (char *)(in->value).type.getters;
      ungetc(__c,(FILE *)self_00);
    }
    else {
      psVar1 = (in->value).type.print;
      (in->value).type.print = (sexp)((long)&psVar1[-1].value + 0x60bf);
      *(char *)((sVar3 - 1) + (long)psVar1) = (char)__c;
    }
    psVar5 = json_read_number(ctx,(sexp_conflict)self_00,in);
    return psVar5;
  }
  if (__c == 0x22) {
    psVar5 = json_read_string(ctx,(sexp_conflict)self_00,in);
    return psVar5;
  }
  if ((__c == 0x2b) || (__c == 0x2d)) goto LAB_001032a7;
  if (__c != 0x46) {
    if (__c == 0x4e) {
LAB_001032e3:
      self_00 = "null";
      psVar5 = (sexp_conflict)sexp_intern(ctx,"null",0xffffffffffffffff);
      pcVar6 = "null";
      goto LAB_00103338;
    }
    if (__c == 0x54) {
LAB_00103309:
      pcVar6 = "true";
      psVar5 = (sexp_conflict)&DAT_0000013e;
      goto LAB_00103338;
    }
    if (__c == 0x5b) {
      psVar5 = json_read_array(ctx,self,in);
      return psVar5;
    }
    if (__c == 0x5d) {
      pcVar6 = "unexpected closing bracket in json";
    }
    else {
      if (__c == 0x66) goto LAB_00103324;
      if (__c == 0x6e) goto LAB_001032e3;
      if (__c == 0x74) goto LAB_00103309;
      if (__c != 0x7d) {
        if (__c == 0x7b) {
          psVar5 = json_read_object(ctx,self,in);
          return psVar5;
        }
        psVar5 = (sexp_conflict)((long)(int)__c << 8 | 0x1e);
        pcVar6 = "unexpected character in json";
        goto LAB_0010339c;
      }
      pcVar6 = "unexpected closing brace in json";
    }
    psVar5 = (sexp_conflict)&DAT_0000023e;
LAB_0010339c:
    psVar5 = sexp_json_read_exception(ctx,(sexp_conflict)self_00,pcVar6,in,psVar5);
    return psVar5;
  }
LAB_00103324:
  pcVar6 = "false";
  psVar5 = (sexp_conflict)&DAT_0000003e;
LAB_00103338:
  json_read_literal(ctx,(sexp_conflict)self_00,in,pcVar6,psVar5);
  return psVar5;
}

Assistant:

sexp json_read (sexp ctx, sexp self, sexp in) {
  sexp res;
  int ch = ' ';
  while (isspace(ch))
    ch = sexp_read_char(ctx, in);
  switch (ch) {
  case '{':
    res = json_read_object(ctx, self, in);
    break;
  case '[':
    res = json_read_array(ctx, self, in);
    break;
  case '"':
    res = json_read_string(ctx, self, in);
    break;
  case '-': case '+':
  case '0': case '1': case '2': case '3': case '4':
  case '5': case '6': case '7': case '8': case '9':
    sexp_push_char(ctx, ch, in);
    res = json_read_number(ctx, self, in);
    break;
  case 'n': case 'N':
    res = json_read_literal(ctx, self, in, "null", sexp_intern(ctx, "null", -1));
    break;
  case 't': case 'T':
    res = json_read_literal(ctx, self, in, "true", SEXP_TRUE);
    break;
  case 'f': case 'F':
    res = json_read_literal(ctx, self, in, "false", SEXP_FALSE);
    break;
  case '}':
    res = sexp_json_read_exception(ctx, self, "unexpected closing brace in json", in, SEXP_NULL);
    break;
  case ']':
    res = sexp_json_read_exception(ctx, self, "unexpected closing bracket in json", in, SEXP_NULL);
    break;
  default:
    res = sexp_json_read_exception(ctx, self, "unexpected character in json", in, sexp_make_character(ch));
    break;
  }
  return res;
}